

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O0

void compare_or(CPUMIPSState_conflict10 *env,wr_t *pwd,wr_t *pws,wr_t *pwt,uint32_t df,int quiet,
               uintptr_t retaddr)

{
  int32_t iVar1;
  uint uVar2;
  float32 fVar3;
  int iVar4;
  int iVar5;
  float_status *pfVar6;
  float64 fVar7;
  int64_t iVar8;
  int64_t cond_3;
  int c_3;
  float_status *status_3;
  int64_t cond_2;
  int c_2;
  float_status *status_2;
  int64_t cond_1;
  int c_1;
  float_status *status_1;
  int64_t cond;
  int c;
  float_status *status;
  uint32_t i;
  wr_t *pwx;
  wr_t wx;
  int quiet_local;
  uint32_t df_local;
  wr_t *pwt_local;
  wr_t *pws_local;
  wr_t *pwd_local;
  CPUMIPSState_conflict10 *env_local;
  
  wx.w[2] = quiet;
  wx.w[3] = df;
  _quiet_local = pwt;
  pwt_local = pws;
  pws_local = pwd;
  pwd_local = (wr_t *)env;
  clear_msacsr_cause(env);
  if (wx.w[3] == 2) {
    for (status._4_4_ = 0; status._4_4_ < 4; status._4_4_ = status._4_4_ + 1) {
      pfVar6 = (float_status *)((long)pwd_local + 0x1ac);
      set_float_exception_flags(0,pfVar6);
      if (wx.w[2] == 0) {
        iVar4 = float32_le_mips64el(pwt_local->w[status._4_4_],_quiet_local->w[status._4_4_],pfVar6)
        ;
      }
      else {
        iVar4 = float32_le_quiet_mips64el
                          (pwt_local->w[status._4_4_],_quiet_local->w[status._4_4_],pfVar6);
      }
      status_1 = (float_status *)(long)iVar4;
      iVar1 = 0;
      if (status_1 != (float_status *)0x0) {
        iVar1 = -1;
      }
      ((wr_t *)&pwx)->w[status._4_4_] = iVar1;
      uVar2 = update_msacsr((CPUMIPSState_conflict10 *)pwd_local,2,0);
      iVar4 = get_enabled_exceptions((CPUMIPSState_conflict10 *)pwd_local,uVar2);
      if (iVar4 != 0) {
        fVar3 = float32_default_nan_mips64el(pfVar6);
        ((wr_t *)&pwx)->w[status._4_4_] = (fVar3 ^ 0x400020) & 0xffffffc0 | uVar2;
      }
      if (((wr_t *)&pwx)->w[status._4_4_] == 0) {
        pfVar6 = (float_status *)((long)pwd_local + 0x1ac);
        set_float_exception_flags(0,pfVar6);
        if (wx.w[2] == 0) {
          iVar4 = float32_le_mips64el(_quiet_local->w[status._4_4_],pwt_local->w[status._4_4_],
                                      pfVar6);
        }
        else {
          iVar4 = float32_le_quiet_mips64el
                            (_quiet_local->w[status._4_4_],pwt_local->w[status._4_4_],pfVar6);
        }
        status_2 = (float_status *)(long)iVar4;
        iVar1 = 0;
        if (status_2 != (float_status *)0x0) {
          iVar1 = -1;
        }
        ((wr_t *)&pwx)->w[status._4_4_] = iVar1;
        uVar2 = update_msacsr((CPUMIPSState_conflict10 *)pwd_local,2,0);
        iVar4 = get_enabled_exceptions((CPUMIPSState_conflict10 *)pwd_local,uVar2);
        if (iVar4 != 0) {
          fVar3 = float32_default_nan_mips64el(pfVar6);
          ((wr_t *)&pwx)->w[status._4_4_] = (fVar3 ^ 0x400020) & 0xffffffc0 | uVar2;
        }
      }
    }
  }
  else {
    if (wx.w[3] != 3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                    ,0x1780,
                    "void compare_or(CPUMIPSState *, wr_t *, wr_t *, wr_t *, uint32_t, int, uintptr_t)"
                   );
    }
    for (status._4_4_ = 0; status._4_4_ < 2; status._4_4_ = status._4_4_ + 1) {
      pfVar6 = (float_status *)((long)pwd_local + 0x1ac);
      set_float_exception_flags(0,pfVar6);
      if (wx.w[2] == 0) {
        iVar4 = float64_le_mips64el(pwt_local->d[status._4_4_],_quiet_local->d[status._4_4_],pfVar6)
        ;
      }
      else {
        iVar4 = float64_le_quiet_mips64el
                          (pwt_local->d[status._4_4_],_quiet_local->d[status._4_4_],pfVar6);
      }
      status_3 = (float_status *)(long)iVar4;
      iVar8 = 0;
      if (status_3 != (float_status *)0x0) {
        iVar8 = -1;
      }
      ((wr_t *)&pwx)->d[status._4_4_] = iVar8;
      iVar4 = update_msacsr((CPUMIPSState_conflict10 *)pwd_local,2,0);
      iVar5 = get_enabled_exceptions((CPUMIPSState_conflict10 *)pwd_local,iVar4);
      if (iVar5 != 0) {
        fVar7 = float64_default_nan_mips64el(pfVar6);
        ((wr_t *)&pwx)->d[status._4_4_] =
             (fVar7 ^ 0x8000000000020) & 0xffffffffffffffc0 | (long)iVar4;
      }
      if (((wr_t *)&pwx)->d[status._4_4_] == 0) {
        pfVar6 = (float_status *)((long)pwd_local + 0x1ac);
        set_float_exception_flags(0,pfVar6);
        if (wx.w[2] == 0) {
          iVar4 = float64_le_mips64el(_quiet_local->d[status._4_4_],pwt_local->d[status._4_4_],
                                      pfVar6);
        }
        else {
          iVar4 = float64_le_quiet_mips64el
                            (_quiet_local->d[status._4_4_],pwt_local->d[status._4_4_],pfVar6);
        }
        iVar8 = 0;
        if (iVar4 != 0) {
          iVar8 = -1;
        }
        ((wr_t *)&pwx)->d[status._4_4_] = iVar8;
        iVar4 = update_msacsr((CPUMIPSState_conflict10 *)pwd_local,2,0);
        iVar5 = get_enabled_exceptions((CPUMIPSState_conflict10 *)pwd_local,iVar4);
        if (iVar5 != 0) {
          fVar7 = float64_default_nan_mips64el(pfVar6);
          ((wr_t *)&pwx)->d[status._4_4_] =
               (fVar7 ^ 0x8000000000020) & 0xffffffffffffffc0 | (long)iVar4;
        }
      }
    }
  }
  check_msacsr_cause((CPUMIPSState_conflict10 *)pwd_local,retaddr);
  msa_move_v(pws_local,(wr_t *)&pwx);
  return;
}

Assistant:

static inline void compare_or(CPUMIPSState *env, wr_t *pwd, wr_t *pws,
                              wr_t *pwt, uint32_t df, int quiet,
                              uintptr_t retaddr)
{
    wr_t wx, *pwx = &wx;
    uint32_t i;

    clear_msacsr_cause(env);

    switch (df) {
    case DF_WORD:
        for (i = 0; i < DF_ELEMENTS(DF_WORD); i++) {
            MSA_FLOAT_OR(pwx->w[i], pws->w[i], pwt->w[i], 32, quiet);
        }
        break;
    case DF_DOUBLE:
        for (i = 0; i < DF_ELEMENTS(DF_DOUBLE); i++) {
            MSA_FLOAT_OR(pwx->d[i], pws->d[i], pwt->d[i], 64, quiet);
        }
        break;
    default:
        assert(0);
    }

    check_msacsr_cause(env, retaddr);

    msa_move_v(pwd, pwx);
}